

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

pair<const_void_*,_int> __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
FindExtension(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *containing_type,
             int field_number)

{
  second_type *psVar1;
  pair<const_void_*,_int> pVar2;
  pair<const_void_*,_int> local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  int local_2c;
  string *psStack_28;
  int field_number_local;
  string *containing_type_local;
  DescriptorIndex<std::pair<const_void_*,_int>_> *this_local;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_2c = field_number;
  psStack_28 = containing_type;
  containing_type_local = (string *)this;
  std::make_pair<std::__cxx11::string_const&,int&>(&local_58,containing_type,&local_2c);
  std::pair<const_void_*,_int>::pair<const_void_*,_int,_true>(&local_68);
  psVar1 = FindWithDefault<std::map<std::pair<std::__cxx11::string,int>,std::pair<void_const*,int>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>>>>
                     (&this->by_extension_,&local_58,&local_68);
  this_local = (DescriptorIndex<std::pair<const_void_*,_int>_> *)psVar1->first;
  uStack_10 = (undefined4)*(undefined8 *)&psVar1->second;
  uStack_c = (undefined4)((ulong)*(undefined8 *)&psVar1->second >> 0x20);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_58);
  pVar2.second = uStack_10;
  pVar2.first = this_local;
  pVar2._12_4_ = 0;
  return pVar2;
}

Assistant:

Value SimpleDescriptorDatabase::DescriptorIndex<Value>::FindExtension(
    const string& containing_type,
    int field_number) {
  return FindWithDefault(
      by_extension_, std::make_pair(containing_type, field_number), Value());
}